

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O1

_Bool borg_flow_dark_reachable(int y,int x)

{
  _Bool _Var1;
  ulong uVar2;
  _Bool _Var3;
  
  _Var3 = true;
  uVar2 = 0;
  while( true ) {
    if (borg_grids[(long)ddy_ddd[uVar2] + (long)y][(long)ddx_ddd[uVar2] + (long)x].feat == '\0') {
      _Var1 = false;
    }
    else {
      _Var1 = borg_cave_floor_grid
                        (borg_grids[(long)ddy_ddd[uVar2] + (long)y] + (long)ddx_ddd[uVar2] + (long)x
                        );
    }
    if (_Var1 != false) break;
    _Var3 = uVar2 < 7;
    uVar2 = uVar2 + 1;
    if (uVar2 == 8) {
      return _Var3;
    }
  }
  return _Var3;
}

Assistant:

static bool borg_flow_dark_reachable(int y, int x)
{
    int j;

    borg_grid *ag;

    /* Scan neighbors */
    for (j = 0; j < 8; j++) {
        int y2 = y + ddy_ddd[j];
        int x2 = x + ddx_ddd[j];

        /* Get the grid */
        ag = &borg_grids[y2][x2];

        /* Skip unknown grids (important) */
        if (ag->feat == FEAT_NONE)
            continue;

        /* Accept known floor grids */
        if (borg_cave_floor_grid(ag))
            return true;
    }

    /* Failure */
    return false;
}